

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O3

void __thiscall
arma::Mat<double>::
Mat<arma::eOp<arma::Col<double>,arma::eop_neg>,arma::eOp<arma::Col<double>,arma::eop_square>,arma::eglue_div>
          (Mat<double> *this,
          eGlue<arma::eOp<arma::Col<double>,_arma::eop_neg>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
          *X)

{
  double dVar1;
  uint uVar2;
  Col<double> *pCVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  uword uVar7;
  ulong uVar8;
  char (*x) [39];
  ulong uVar9;
  
  pCVar3 = (((X->P1).Q)->P).Q;
  this->n_rows = (pCVar3->super_Mat<double>).n_rows;
  this->n_cols = 1;
  uVar2 = (pCVar3->super_Mat<double>).n_elem;
  uVar8 = (ulong)uVar2;
  uVar7 = 0;
  this->n_elem = uVar2;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  if (uVar8 < 0x11) {
    pdVar6 = this->mem_local;
    if (uVar8 == 0) {
      pdVar6 = (double *)0x0;
    }
    this->mem = pdVar6;
  }
  else {
    x = (char (*) [39])(uVar8 << 3);
    pdVar6 = (double *)lkalloc::malloc((size_t)x);
    if (pdVar6 == (double *)0x0) {
      arma_stop_bad_alloc<char[39]>(x);
    }
    this->mem = pdVar6;
    uVar7 = this->n_elem;
  }
  this->n_alloc = uVar7;
  pCVar3 = (((X->P1).Q)->P).Q;
  uVar8 = (ulong)(pCVar3->super_Mat<double>).n_elem;
  if (((ulong)pdVar6 & 0xf) == 0) {
    pdVar4 = (pCVar3->super_Mat<double>).mem;
    if ((((ulong)pdVar4 & 0xf) == 0) &&
       (pdVar5 = (((((X->P2).Q)->P).Q)->super_Mat<double>).mem, ((ulong)pdVar5 & 0xf) == 0)) {
      if (uVar8 != 0) {
        uVar9 = 0;
        do {
          dVar1 = pdVar5[uVar9];
          pdVar6[uVar9] = -pdVar4[uVar9] / (dVar1 * dVar1);
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
    }
    else if (uVar8 != 0) {
      pdVar5 = (((((X->P2).Q)->P).Q)->super_Mat<double>).mem;
      uVar9 = 0;
      do {
        dVar1 = pdVar5[uVar9];
        pdVar6[uVar9] = -pdVar4[uVar9] / (dVar1 * dVar1);
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
  }
  else if (uVar8 != 0) {
    pdVar4 = (pCVar3->super_Mat<double>).mem;
    pdVar5 = (((((X->P2).Q)->P).Q)->super_Mat<double>).mem;
    uVar9 = 0;
    do {
      dVar1 = pdVar5[uVar9];
      pdVar6[uVar9] = -pdVar4[uVar9] / (dVar1 * dVar1);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eGlue<T1, T2, eglue_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  arma_type_check(( is_same_type< eT, typename T2::elem_type >::no ));
  
  init_cold();
  
  eglue_type::apply(*this, X);
  }